

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaFxch.c
# Opt level: O1

void Fxch_ManUpdate(Fxch_Man_t *p,int iDiv)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  word *pwVar12;
  Vec_Int_t *pVVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  int *piVar17;
  long lVar18;
  int *piVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  int *piVar25;
  ulong uVar26;
  int *piVar27;
  Vec_Int_t *pVVar28;
  uint local_48;
  uint local_40;
  
  uVar9 = Gia_ManRandom(0);
  Vec_IntPush(&p->vRands,uVar9 & 0x3ffffff);
  uVar9 = Gia_ManRandom(0);
  Vec_IntPush(&p->vRands,uVar9 & 0x3ffffff);
  if (iDiv < 0) {
LAB_0035c28d:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  pVVar13 = p->vHash->vObjs;
  uVar14 = iDiv * 4;
  uVar9 = pVVar13->nSize;
  if (uVar9 == uVar14 || SBORROW4(uVar9,uVar14) != (int)(uVar9 + iDiv * -4) < 0) goto LAB_0035c28d;
  piVar3 = pVVar13->pArray;
  uVar9 = piVar3[uVar14];
  uVar26 = (ulong)(int)uVar9;
  if ((long)uVar26 < 0) {
LAB_0035c2ac:
    __assert_fail("Lit0 >= 0 && Lit1 >= 0 && Lit0 < Lit1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                  ,0x276,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
  }
  uVar14 = piVar3[(ulong)uVar14 + 1];
  uVar23 = (ulong)uVar14;
  if (((int)uVar14 < 0) || ((int)uVar14 <= (int)uVar9)) goto LAB_0035c2ac;
  uVar20 = (p->vDivs).nCap;
  if ((p->vDivs).nSize == uVar20) {
    if ((int)uVar20 < 0x10) {
      pwVar12 = (p->vDivs).pArray;
      if (pwVar12 == (word *)0x0) {
        pwVar12 = (word *)malloc(0x80);
      }
      else {
        pwVar12 = (word *)realloc(pwVar12,0x80);
      }
      (p->vDivs).pArray = pwVar12;
      iVar11 = 0x10;
    }
    else {
      iVar11 = uVar20 * 2;
      if (iVar11 <= (int)uVar20) goto LAB_0035b781;
      pwVar12 = (p->vDivs).pArray;
      if (pwVar12 == (word *)0x0) {
        pwVar12 = (word *)malloc((ulong)uVar20 << 4);
      }
      else {
        pwVar12 = (word *)realloc(pwVar12,(ulong)uVar20 << 4);
      }
      (p->vDivs).pArray = pwVar12;
    }
    if (pwVar12 == (word *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                    ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    (p->vDivs).nCap = iVar11;
  }
LAB_0035b781:
  iVar11 = (p->vDivs).nSize;
  (p->vDivs).nSize = iVar11 + 1;
  (p->vDivs).pArray[iVar11] = uVar23 << 0x20 | uVar26;
  iVar11 = (p->vLits).nSize;
  if (((int)uVar9 < iVar11) && ((int)uVar14 < iVar11)) {
    pVVar13 = (p->vLits).pArray;
    uVar20 = pVVar13[uVar26].nSize;
    uVar21 = (ulong)uVar20;
    if ((int)uVar20 < 1) {
      uVar10 = 0;
    }
    else {
      piVar3 = pVVar13[uVar26].pArray;
      lVar16 = 0;
      uVar10 = 0;
      do {
        iVar11 = piVar3[lVar16];
        if (((long)iVar11 < 0) || ((p->vCubes).nSize <= iVar11)) goto LAB_0035c195;
        if (0 < (p->vCubes).pArray[iVar11].nSize) {
          if (((int)uVar10 < 0) || ((int)uVar21 <= (int)uVar10)) goto LAB_0035c176;
          uVar21 = (ulong)uVar10;
          uVar10 = uVar10 + 1;
          piVar3[uVar21] = iVar11;
        }
        lVar16 = lVar16 + 1;
        uVar20 = pVVar13[uVar26].nSize;
        uVar21 = (ulong)(int)uVar20;
      } while (lVar16 < (long)uVar21);
    }
    if ((int)uVar10 <= (int)uVar20) {
      pVVar13[uVar26].nSize = uVar10;
      uVar20 = pVVar13[uVar23].nSize;
      uVar21 = (ulong)uVar20;
      if ((int)uVar20 < 1) {
        uVar10 = 0;
      }
      else {
        piVar3 = pVVar13[uVar23].pArray;
        lVar16 = 0;
        uVar10 = 0;
        do {
          iVar11 = piVar3[lVar16];
          if (((long)iVar11 < 0) || ((p->vCubes).nSize <= iVar11)) goto LAB_0035c195;
          if (0 < (p->vCubes).pArray[iVar11].nSize) {
            if (((int)uVar10 < 0) || ((int)uVar21 <= (int)uVar10)) goto LAB_0035c176;
            uVar21 = (ulong)uVar10;
            uVar10 = uVar10 + 1;
            piVar3[uVar21] = iVar11;
          }
          lVar16 = lVar16 + 1;
          uVar20 = pVVar13[uVar23].nSize;
          uVar21 = (ulong)(int)uVar20;
        } while (lVar16 < (long)uVar21);
      }
      if ((int)uVar10 <= (int)uVar20) {
        pVVar13[uVar23].nSize = uVar10;
        piVar17 = pVVar13[uVar26].pArray;
        piVar19 = pVVar13[uVar23].pArray;
        iVar11 = pVVar13[uVar26].nSize;
        piVar3 = piVar17 + iVar11;
        piVar1 = piVar19 + (int)uVar10;
        (p->vCubesS).nSize = 0;
        piVar25 = piVar19;
        piVar27 = piVar17;
        if ((0 < (int)uVar10) && (0 < iVar11)) {
          do {
            iVar11 = *piVar27;
            iVar2 = *piVar19;
            if (iVar11 == iVar2) {
              Vec_IntPush(&p->vCubesS,iVar11);
              piVar27 = piVar27 + 1;
              piVar19 = piVar19 + 1;
            }
            else if (iVar11 < iVar2) {
              piVar27 = piVar27 + 1;
              *piVar17 = iVar11;
              piVar17 = piVar17 + 1;
            }
            else {
              piVar19 = piVar19 + 1;
              *piVar25 = iVar2;
              piVar25 = piVar25 + 1;
            }
          } while ((piVar27 < piVar3) && (piVar19 < piVar1));
        }
        for (; piVar27 < piVar3; piVar27 = piVar27 + 1) {
          *piVar17 = *piVar27;
          piVar17 = piVar17 + 1;
        }
        for (; piVar19 < piVar1; piVar19 = piVar19 + 1) {
          *piVar25 = *piVar19;
          piVar25 = piVar25 + 1;
        }
        iVar11 = (int)((ulong)((long)piVar17 - (long)pVVar13[uVar26].pArray) >> 2);
        if (iVar11 <= pVVar13[uVar26].nSize) {
          pVVar13[uVar26].nSize = iVar11;
          iVar11 = (int)((ulong)((long)piVar25 - (long)pVVar13[uVar23].pArray) >> 2);
          if (iVar11 <= pVVar13[uVar23].nSize) {
            pVVar13[uVar23].nSize = iVar11;
            uVar20 = (p->vCubesS).nSize;
            uVar26 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar10 = 0;
            }
            else {
              piVar3 = (p->vCubesS).pArray;
              lVar16 = 0;
              uVar10 = 0;
              do {
                uVar20 = piVar3[lVar16];
                lVar22 = (long)(int)uVar20;
                if ((lVar22 < 0) || ((p->vCubes).nSize <= (int)uVar20)) goto LAB_0035c195;
                pVVar13 = (p->vCubes).pArray;
                lVar24 = (long)pVVar13[lVar22].nSize;
                if (0 < lVar24) {
                  lVar18 = 0;
                  bVar6 = false;
                  bVar8 = false;
                  do {
                    uVar15 = pVVar13[lVar22].pArray[lVar18];
                    bVar7 = bVar8;
                    if (uVar15 == uVar14) {
                      bVar7 = true;
                    }
                    if (uVar15 == uVar9) {
                      bVar6 = true;
                      bVar7 = bVar8;
                    }
                    lVar18 = lVar18 + 1;
                    bVar8 = bVar7;
                  } while (lVar24 != lVar18);
                  if ((bVar6) && (bVar7)) {
                    if (0xffffff < uVar20) {
                      __assert_fail("!(iCube >> 24) && !(iLit >> 8)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/pla.h"
                                    ,0x5d,"int Pla_CubeHandle(int, int)");
                    }
                    if (((int)uVar10 < 0) || ((int)uVar26 <= (int)uVar10)) {
LAB_0035c176:
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                    }
                    uVar26 = (ulong)uVar10;
                    uVar10 = uVar10 + 1;
                    piVar3[uVar26] = uVar20 << 8 | 0xff;
                  }
                }
                lVar16 = lVar16 + 1;
                uVar20 = (p->vCubesS).nSize;
                uVar26 = (ulong)(int)uVar20;
              } while (lVar16 < (long)uVar26);
            }
            if ((int)uVar10 <= (int)uVar20) {
              (p->vCubesS).nSize = uVar10;
              if (iDiv < (p->vPairs).nSize) {
                pVVar13 = (p->vPairs).pArray;
                local_40 = uVar9 ^ 1;
                local_48 = uVar14 ^ 1;
                (p->vCubesD).nSize = 0;
                if (1 < pVVar13[(uint)iDiv].nSize) {
                  lVar16 = 1;
                  do {
                    uVar20 = pVVar13[(uint)iDiv].pArray[lVar16 + -1];
                    uVar10 = pVVar13[(uint)iDiv].pArray[lVar16];
                    iVar11 = Fxch_TabCompare(p,uVar20,uVar10);
                    if (iVar11 != 0) {
                      uVar15 = (int)uVar20 >> 8;
                      if (((int)uVar15 < 0) || (iVar11 = (p->vCubes).nSize, iVar11 <= (int)uVar15))
                      goto LAB_0035c195;
                      pVVar4 = (p->vCubes).pArray;
                      if (pVVar4[uVar15].nSize <= (int)(uVar20 & 0xff)) goto LAB_0035c1b4;
                      if (pVVar4[uVar15].pArray[uVar20 & 0xff] == local_40) {
                        uVar15 = (int)uVar10 >> 8;
                        if (((int)uVar15 < 0) || (iVar11 <= (int)uVar15)) goto LAB_0035c195;
                        if (pVVar4[uVar15].nSize <= (int)(uVar10 & 0xff)) goto LAB_0035c1b4;
                        if (pVVar4[uVar15].pArray[uVar10 & 0xff] == local_48) {
                          Vec_IntPush(&p->vCubesD,uVar20);
                          Vec_IntPush(&p->vCubesD,uVar10);
                        }
                      }
                    }
                    lVar16 = lVar16 + 2;
                  } while ((int)lVar16 < pVVar13[(uint)iDiv].nSize);
                }
                pVVar13[(uint)iDiv].nSize = 0;
                uVar20 = (p->vCubesD).nSize;
                if ((uVar20 & 1) != 0) {
                  __assert_fail("Vec_IntSize(&p->vCubesD) % 2 == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                                ,0x28a,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
                }
                if (3 < (int)uVar20) {
                  qsort((p->vCubesD).pArray,(ulong)(uVar20 >> 1),8,Vec_IntSortCompare1);
                  iVar11 = 2;
                  if (3 < (p->vCubesD).nSize) {
                    piVar3 = (p->vCubesD).pArray;
                    iVar11 = 1;
                    lVar16 = 1;
                    do {
                      if ((piVar3[lVar16 * 2] != piVar3[lVar16 * 2 + -2]) ||
                         (piVar3[lVar16 * 2 + 1] != piVar3[lVar16 * 2 + -1])) {
                        piVar3[iVar11 * 2] = piVar3[lVar16 * 2];
                        piVar3[iVar11 * 2 + 1] = piVar3[lVar16 * 2 + 1];
                        iVar11 = iVar11 + 1;
                      }
                      lVar16 = lVar16 + 1;
                    } while (lVar16 < (p->vCubesD).nSize / 2);
                    iVar11 = iVar11 * 2;
                  }
                  (p->vCubesD).nSize = iVar11;
                }
                if (((p->vCubesD).nSize & 1) != 0) {
                  __assert_fail("Vec_IntSize(&p->vCubesD) % 2 == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                                ,0x28c,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
                }
                if (0 < (p->vCubesS).nSize) {
                  lVar16 = 0;
                  do {
                    Fxch_TabSingleDivisors(p,(p->vCubesS).pArray[lVar16] >> 8,0);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 < (p->vCubesS).nSize);
                }
                if (1 < (p->vCubesD).nSize) {
                  lVar16 = 1;
                  do {
                    piVar3 = (p->vCubesD).pArray;
                    iVar11 = piVar3[lVar16];
                    Fxch_TabSingleDivisors(p,piVar3[lVar16 + -1] >> 8,0);
                    Fxch_TabSingleDivisors(p,iVar11 >> 8,0);
                    lVar16 = lVar16 + 2;
                  } while ((int)lVar16 < (p->vCubesD).nSize);
                }
                if (0 < (p->vCubesS).nSize) {
                  lVar16 = 0;
                  do {
                    Fxch_TabDoubleDivisors(p,(p->vCubesS).pArray[lVar16] >> 8,0);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 < (p->vCubesS).nSize);
                }
                if (1 < (p->vCubesD).nSize) {
                  lVar16 = 1;
                  do {
                    piVar3 = (p->vCubesD).pArray;
                    iVar11 = piVar3[lVar16];
                    Fxch_TabDoubleDivisors(p,piVar3[lVar16 + -1] >> 8,0);
                    Fxch_TabDoubleDivisors(p,iVar11 >> 8,0);
                    lVar16 = lVar16 + 2;
                  } while ((int)lVar16 < (p->vCubesD).nSize);
                }
                p->nLits = p->nLits + 2;
                iVar11 = (p->vLits).nSize;
                Vec_WecPushLevel(&p->vLits);
                pVVar13 = Vec_WecPushLevel(&p->vLits);
                lVar16 = (long)(p->vLits).nSize;
                if (1 < lVar16) {
                  pVVar4 = (p->vLits).pArray;
                  if (0 < (p->vCubesS).nSize) {
                    lVar22 = 0;
                    do {
                      uVar20 = (p->vCubesS).pArray[lVar22] >> 8;
                      if (((int)uVar20 < 0) || ((p->vCubes).nSize <= (int)uVar20))
                      goto LAB_0035c195;
                      pVVar28 = (p->vCubes).pArray;
                      pVVar5 = pVVar28 + uVar20;
                      uVar10 = pVVar28[uVar20].nSize;
                      uVar26 = (ulong)uVar10;
                      if ((int)uVar10 < 1) {
                        uVar15 = 0;
                      }
                      else {
                        piVar3 = pVVar5->pArray;
                        lVar24 = 0;
                        uVar15 = 0;
                        do {
                          uVar10 = piVar3[lVar24];
                          if ((uVar10 != uVar9) && (uVar10 != uVar14)) {
                            if (((int)uVar15 < 0) || ((int)uVar26 <= (int)uVar15))
                            goto LAB_0035c176;
                            uVar26 = (ulong)uVar15;
                            uVar15 = uVar15 + 1;
                            piVar3[uVar26] = uVar10;
                          }
                          lVar24 = lVar24 + 1;
                          uVar10 = pVVar5->nSize;
                          uVar26 = (ulong)(int)uVar10;
                        } while (lVar24 < (long)uVar26);
                      }
                      if (uVar10 != uVar15 + 2) {
                        __assert_fail("Vec_IntSize(p) == k + 2",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                                      ,0x133,"void Fxch_CompressLiterals(Vec_Int_t *, int, int)");
                      }
                      pVVar5->nSize = uVar15;
                      Vec_IntPush(pVVar4 + lVar16 + -2,uVar20);
                      if (iVar11 < -1) goto LAB_0035c1d3;
                      Vec_IntPush(pVVar5,(iVar11 / 2) * 2);
                      p->nLits = p->nLits + -1;
                      lVar22 = lVar22 + 1;
                    } while (lVar22 < (p->vCubesS).nSize);
                  }
                  if (1 < (p->vCubesD).nSize) {
                    lVar22 = 0;
                    do {
                      piVar3 = (p->vCubesD).pArray;
                      uVar9 = piVar3[lVar22];
                      uVar14 = (int)uVar9 >> 8;
                      if (((int)uVar14 < 0) || (iVar2 = (p->vCubes).nSize, iVar2 <= (int)uVar14))
                      goto LAB_0035c195;
                      uVar20 = piVar3[lVar22 + 1];
                      uVar10 = (int)uVar20 >> 8;
                      if (((int)uVar10 < 0) || (iVar2 <= (int)uVar10)) goto LAB_0035c195;
                      pVVar5 = (p->vCubes).pArray;
                      pVVar28 = pVVar5 + uVar14;
                      uVar9 = uVar9 & 0xff;
                      uVar15 = pVVar28->nSize;
                      uVar26 = (ulong)uVar15;
                      if ((int)uVar15 <= (int)uVar9) {
LAB_0035c1b4:
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                      }
                      piVar3 = pVVar28->pArray;
                      if (piVar3[uVar9] != local_40) {
                        __assert_fail("Vec_IntEntry(vCube1, Pla_CubeLit(hCube1)) == Abc_LitNot(Lit0)"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                                      ,0x2c8,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
                      }
                      uVar20 = uVar20 & 0xff;
                      if (pVVar5[uVar10].nSize <= (int)uVar20) goto LAB_0035c1b4;
                      if (pVVar5[uVar10].pArray[uVar20] != local_48) {
                        __assert_fail("Vec_IntEntry(vCube2, Pla_CubeLit(hCube2)) == Abc_LitNot(Lit1)"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                                      ,0x2c9,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
                      }
                      if ((int)uVar15 < 1) {
                        uVar20 = 0;
                      }
                      else {
                        uVar23 = 0;
                        uVar20 = 0;
                        do {
                          if (uVar9 != uVar23) {
                            if (((int)uVar20 < 0) || ((int)uVar26 <= (int)uVar20))
                            goto LAB_0035c176;
                            uVar26 = (ulong)uVar20;
                            uVar20 = uVar20 + 1;
                            piVar3[uVar26] = piVar3[uVar23];
                          }
                          uVar23 = uVar23 + 1;
                          uVar15 = pVVar28->nSize;
                          uVar26 = (ulong)(int)uVar15;
                        } while ((long)uVar23 < (long)uVar26);
                      }
                      if ((int)uVar15 < (int)uVar20) goto LAB_0035c1f2;
                      pVVar28->nSize = uVar20;
                      Vec_IntPush(pVVar13,uVar14);
                      if (iVar11 < -1) {
LAB_0035c1d3:
                        __assert_fail("Var >= 0 && !(c >> 1)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                                      ,0x10b,"int Abc_Var2Lit(int, int)");
                      }
                      Vec_IntPush(pVVar28,(iVar11 / 2) * 2 + 1);
                      p->nLits = p->nLits - pVVar5[uVar10].nSize;
                      pVVar5[uVar10].nSize = 0;
                      lVar22 = lVar22 + 2;
                    } while ((int)((uint)lVar22 | 1) < (p->vCubesD).nSize);
                  }
                  qsort(pVVar13->pArray,(long)pVVar13->nSize,4,Vec_IntSortCompare1);
                  qsort(pVVar4[lVar16 + -2].pArray,(long)pVVar4[lVar16 + -2].nSize,4,
                        Vec_IntSortCompare1);
                  if (0 < (p->vCubesS).nSize) {
                    lVar16 = 0;
                    do {
                      Fxch_TabSingleDivisors(p,(p->vCubesS).pArray[lVar16] >> 8,1);
                      lVar16 = lVar16 + 1;
                    } while (lVar16 < (p->vCubesS).nSize);
                  }
                  if (1 < (p->vCubesD).nSize) {
                    lVar16 = 0;
                    do {
                      Fxch_TabSingleDivisors(p,(p->vCubesD).pArray[lVar16] >> 8,1);
                      iVar11 = (int)lVar16;
                      lVar16 = lVar16 + 2;
                    } while (iVar11 + 3 < (p->vCubesD).nSize);
                  }
                  if (0 < (p->vCubesS).nSize) {
                    lVar16 = 0;
                    do {
                      Fxch_TabDoubleDivisors(p,(p->vCubesS).pArray[lVar16] >> 8,1);
                      lVar16 = lVar16 + 1;
                    } while (lVar16 < (p->vCubesS).nSize);
                  }
                  if (1 < (p->vCubesD).nSize) {
                    lVar16 = 0;
                    do {
                      Fxch_TabDoubleDivisors(p,(p->vCubesD).pArray[lVar16] >> 8,1);
                      iVar11 = (int)lVar16;
                      lVar16 = lVar16 + 2;
                    } while (iVar11 + 3 < (p->vCubesD).nSize);
                  }
                  return;
                }
              }
              goto LAB_0035c195;
            }
          }
        }
      }
    }
LAB_0035c1f2:
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
LAB_0035c195:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

void Fxch_ManUpdate( Fxch_Man_t * p, int iDiv )
{
    Vec_Int_t * vCube1, * vCube2, * vLitP, * vLitN;
    //int nLitsNew = p->nLits - (int)Vec_FltEntry(&p->vWeights, iDiv);
    int i, Lit0, Lit1, hCube1, hCube2, iVarNew;
    //float Diff = Vec_FltEntry(&p->vWeights, iDiv) - (float)((int)Vec_FltEntry(&p->vWeights, iDiv));
    //assert( Diff > 0.0 && Diff < 1.0 );

    // get the divisor and select pivot variables
    Vec_IntPush( &p->vRands, Gia_ManRandom(0) & 0x3FFFFFF ); 
    Vec_IntPush( &p->vRands, Gia_ManRandom(0) & 0x3FFFFFF );
    Lit0 = Hash_IntObjData0( p->vHash, iDiv );
    Lit1 = Hash_IntObjData1( p->vHash, iDiv );
    assert( Lit0 >= 0 && Lit1 >= 0 && Lit0 < Lit1 );
    Vec_WrdPush( &p->vDivs, ((word)Lit1 << 32) | (word)Lit0 );

    // if the input cover is not prime, it may happen that we are extracting divisor (x + !x)
    // although it is not strictly correct, it seems to be fine to just skip such divisors
//    if ( Abc_Lit2Var(Lit0) == Abc_Lit2Var(Lit1) && Vec_IntSize(Hsh_VecReadEntry(p->vHash, iDiv)) == 2 )
//        return;

    // collect single-cube-divisor cubes
    vLitP = Vec_WecEntry(&p->vLits, Lit0);
    vLitN = Vec_WecEntry(&p->vLits, Lit1);
    Fxch_CompressCubes( p, vLitP );
    Fxch_CompressCubes( p, vLitN );
//    Fxch_CollectSingles( vLitP, vLitN, &p->vCubesS );
//    assert( Vec_IntSize(&p->vCubesS) % 2 == 0 );
    Vec_IntTwoRemoveCommon( vLitP, vLitN, &p->vCubesS );
    Fxch_FilterCubes( p, &p->vCubesS, Lit0, Lit1 );

    // collect double-cube-divisor cube pairs
    Fxch_CollectDoubles( p, Vec_WecEntry(&p->vPairs, iDiv), &p->vCubesD, Abc_LitNot(Lit0), Abc_LitNot(Lit1) );
    assert( Vec_IntSize(&p->vCubesD) % 2 == 0 );
    Vec_IntUniqifyPairs( &p->vCubesD );
    assert( Vec_IntSize(&p->vCubesD) % 2 == 0 );

    // subtract cost of single-cube divisors
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube1), 0 );  // remove - update
    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube1), 0 ),  // remove - update
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube2), 0 );  // remove - update

    // subtract cost of double-cube divisors
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
    {
        //printf( "%d ", Pla_CubeNum(hCube1) );
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube1), 0 );  // remove - update
    }
    //printf( "\n" );

    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
    {
        //printf( "%d ", Pla_CubeNum(hCube1) );
        //printf( "%d  ", Pla_CubeNum(hCube2) );
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube1), 0 ),  // remove - update
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube2), 0 );  // remove - update
    }
    //printf( "\n" );

    // create new literals
    p->nLits += 2;
    iVarNew = Vec_WecSize( &p->vLits ) / 2;
    vLitP = Vec_WecPushLevel( &p->vLits );
    vLitN = Vec_WecPushLevel( &p->vLits );
    vLitP = Vec_WecEntry( &p->vLits, Vec_WecSize(&p->vLits) - 2 );
    // update single-cube divisor cubes
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
    {
//        int Lit0s, Lit1s;
        vCube1 = Fxch_ManCube( p, hCube1 );
//        Lit0s = Vec_IntEntry(vCube1, Pla_CubeLit(hCube1));
//        Lit1s = Vec_IntEntry(vCube1, Pla_CubeLit(hCube2));
//        assert( Pla_CubeNum(hCube1) == Pla_CubeNum(hCube2) );
//        assert( Vec_IntEntry(vCube1, Pla_CubeLit(hCube1)) == Lit0 );
//        assert( Vec_IntEntry(vCube1, Pla_CubeLit(hCube2)) == Lit1 );
        Fxch_CompressLiterals( vCube1, Lit0, Lit1 );
//        Vec_IntPush( vLitP, Pla_CubeHandle(Pla_CubeNum(hCube1), Vec_IntSize(vCube1)) );
        Vec_IntPush( vLitP, Pla_CubeNum(hCube1) );
        Vec_IntPush( vCube1, Abc_Var2Lit(iVarNew, 0) );

        //if ( Pla_CubeNum(hCube1) == 3 )
        //    printf( "VecSize = %d\n", Vec_IntSize(vCube1) );

        p->nLits--;
    }
    // update double-cube divisor cube pairs
    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
    {
        vCube1 = Fxch_ManCube( p, hCube1 );
        vCube2 = Fxch_ManCube( p, hCube2 );
        assert( Vec_IntEntry(vCube1, Pla_CubeLit(hCube1)) == Abc_LitNot(Lit0) );
        assert( Vec_IntEntry(vCube2, Pla_CubeLit(hCube2)) == Abc_LitNot(Lit1) );
        Fxch_CompressLiterals2( vCube1, Pla_CubeLit(hCube1), -1 );
//        Vec_IntPush( vLitN, Pla_CubeHandle(Pla_CubeNum(hCube1), Vec_IntSize(vCube1)) );
        Vec_IntPush( vLitN, Pla_CubeNum(hCube1) );
        Vec_IntPush( vCube1, Abc_Var2Lit(iVarNew, 1) );
        p->nLits -= Vec_IntSize(vCube2);

        //if ( Pla_CubeNum(hCube1) == 3 )
        //    printf( "VecSize = %d\n", Vec_IntSize(vCube1) );

        // remove second cube
        Vec_IntClear( vCube2 ); 
    }
    Vec_IntSort( vLitN, 0 );
    Vec_IntSort( vLitP, 0 );

    // add cost of single-cube divisors
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube1), 1 );  // add - update
    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube1), 1 );  // add - update

    // add cost of double-cube divisors
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube1), 1 );  // add - update
    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube1), 1 );  // add - update
    
    // check predicted improvement: (new SOP lits == old SOP lits - divisor weight)
    //assert( p->nLits == nLitsNew );
}